

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::TJ
          (AbstractContentContext *this,GlyphUnicodeMappingListOrDoubleList *inStringsAndSpacing)

{
  GraphicStateStack *this_00;
  double dVar1;
  bool bVar2;
  EStatusCode EVar3;
  int iVar4;
  PDFUsedFont *this_01;
  Trace *pTVar5;
  undefined4 extraout_var;
  GraphicState *pGVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  bool writeAsCID;
  char formattingBuffer [5];
  OutputStringBufferStream stringStream;
  value_type local_120;
  AbstractContentContext *local_f0;
  StringOrDoubleList stringOrDoubleList;
  ObjectIDType fontObjectID;
  _List_node_base *local_c8;
  UShortListList encodedCharachtersListsList;
  GlyphUnicodeMappingListList stringsList;
  string fontName;
  string local_70;
  string local_50;
  
  this_01 = GetCurrentFont(this);
  if (this_01 == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Cannot write text, no current font is defined");
    return eSuccess;
  }
  stringsList.
  super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var9 = (_List_node_base *)inStringsAndSpacing;
  stringsList.
  super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stringsList;
  stringsList.
  super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&stringsList;
  while (p_Var9 = (((_List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)inStringsAndSpacing) {
    if (*(char *)&p_Var9[3]._M_next == '\0') {
      std::__cxx11::
      list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
      ::push_back((list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                   *)&stringsList,(value_type *)(p_Var9 + 1));
    }
  }
  encodedCharachtersListsList.
  super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl._M_node._M_size = 0;
  encodedCharachtersListsList.
  super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&encodedCharachtersListsList;
  encodedCharachtersListsList.
  super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&encodedCharachtersListsList;
  EVar3 = PDFUsedFont::EncodeStringsForShowing
                    (this_01,&stringsList,&fontObjectID,&encodedCharachtersListsList,&writeAsCID);
  if (EVar3 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation"
                     );
    EVar3 = eFailure;
    goto LAB_0016f61e;
  }
  EVar3 = eSuccess;
  if ((encodedCharachtersListsList.
       super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next ==
       (_List_node_base *)&encodedCharachtersListsList) || (fontObjectID == 0)) goto LAB_0016f61e;
  iVar4 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            (&fontName,(ResourcesDictionary *)CONCAT44(extraout_var,iVar4),fontObjectID);
  this_00 = &this->mGraphicStack;
  pGVar6 = GraphicStateStack::GetCurrentState(this_00);
  bVar2 = std::operator!=(&pGVar6->mPlacedFontName,&fontName);
  if (bVar2) {
LAB_0016f376:
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    TfLow(this,&fontName,pGVar6->mFontSize);
  }
  else {
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    dVar1 = pGVar6->mPlacedFontSize;
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    if ((dVar1 != pGVar6->mFontSize) || (NAN(dVar1) || NAN(pGVar6->mFontSize))) goto LAB_0016f376;
  }
  OutputStringBufferStream::OutputStringBufferStream(&stringStream);
  stringOrDoubleList.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stringOrDoubleList;
  stringOrDoubleList.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_f0 = this;
  stringOrDoubleList.
  super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       stringOrDoubleList.
       super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (writeAsCID == false) {
    p_Var7 = encodedCharachtersListsList.
             super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    p_Var9 = (_List_node_base *)inStringsAndSpacing;
    while (p_Var9 = (((_List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)inStringsAndSpacing) {
      if (*(char *)&p_Var9[3]._M_next == '\x01') {
        local_120.DoubleValue = (double)p_Var9[2]._M_prev;
        local_120.SomeValue._M_dataplus._M_p = (pointer)&local_120.SomeValue.field_2;
        local_120.SomeValue._M_string_length = 0;
        local_120.SomeValue.field_2._M_local_buf[0] = '\0';
        local_120.IsDouble = true;
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&stringOrDoubleList,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
      }
      else {
        p_Var8 = p_Var7 + 1;
        while (p_Var8 = p_Var8->_M_next, p_Var8 != p_Var7 + 1) {
          formattingBuffer[0] = *(char *)&p_Var8[1]._M_next;
          OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
        }
        OutputStringBufferStream::ToString_abi_cxx11_(&local_70,&stringStream);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_120,&local_70);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&stringOrDoubleList,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_70);
        OutputStringBufferStream::Reset(&stringStream);
        p_Var7 = p_Var7->_M_next;
      }
    }
    TJLow(local_f0,&stringOrDoubleList);
  }
  else {
    p_Var7 = encodedCharachtersListsList.
             super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    p_Var9 = (_List_node_base *)inStringsAndSpacing;
    while( true ) {
      p_Var9 = (((_List_base<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var9 == (_List_node_base *)inStringsAndSpacing) break;
      if (*(char *)&p_Var9[3]._M_next == '\x01') {
        local_120.DoubleValue = (double)p_Var9[2]._M_prev;
        local_120.SomeValue._M_dataplus._M_p = (pointer)&local_120.SomeValue.field_2;
        local_120.SomeValue._M_string_length = 0;
        local_120.SomeValue.field_2._M_local_buf[0] = '\0';
        local_120.IsDouble = true;
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&stringOrDoubleList,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
      }
      else {
        p_Var8 = p_Var7 + 1;
        local_c8 = p_Var8;
        while( true ) {
          p_Var8 = p_Var8->_M_next;
          if (p_Var8 == local_c8) break;
          formattingBuffer[0] = *(char *)((long)&p_Var8[1]._M_next + 1);
          OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
          formattingBuffer[0] = *(char *)&p_Var8[1]._M_next;
          OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
        }
        OutputStringBufferStream::ToString_abi_cxx11_(&local_50,&stringStream);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_120,&local_50);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&stringOrDoubleList,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_50);
        OutputStringBufferStream::Reset(&stringStream);
        p_Var7 = p_Var7->_M_next;
      }
    }
    TJHexLow(local_f0,&stringOrDoubleList);
  }
  EVar3 = eSuccess;
  std::__cxx11::
  _List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&stringOrDoubleList.
              super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
  OutputStringBufferStream::~OutputStringBufferStream(&stringStream);
  std::__cxx11::string::~string((string *)&fontName);
LAB_0016f61e:
  std::__cxx11::
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::_M_clear(&encodedCharachtersListsList.
              super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ::_M_clear(&stringsList.
              super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
            );
  return EVar3;
}

Assistant:

EStatusCode AbstractContentContext::TJ(const GlyphUnicodeMappingListOrDoubleList& inStringsAndSpacing)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::TJ, Cannot write text, no current font is defined");
		return PDFHummus::eSuccess;
	}

	// TJ is a bit different. i want to encode all strings in the array to the same font, so that at most a single
	// Tf is used...and command may be written as is. for that we need to encode all strings at once...which requires
	// a slightly different algorithm

	// first, list all the strings, so that you can encode them
	GlyphUnicodeMappingListList stringsList;
	GlyphUnicodeMappingListOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	
	for(; it != inStringsAndSpacing.end(); ++it)
		if(!it->IsDouble)
			stringsList.push_back(it->SomeValue);

	// now, encode all strings at once

	ObjectIDType fontObjectID;
	UShortListList encodedCharachtersListsList;
	bool writeAsCID;	

	if(currentFont->EncodeStringsForShowing(stringsList,fontObjectID,encodedCharachtersListsList,writeAsCID)!= PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharachtersListsList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// status only returns if strings can be coded or not. so continue with writing regardless

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	StringOrDoubleList stringOrDoubleList;
	UShortListList::iterator itEncodedList = encodedCharachtersListsList.begin();
	UShortList::iterator itEncoded;

	if(writeAsCID)
	{
		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = ((*itEncoded) >> 8) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);					
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJHexLow(stringOrDoubleList);
	}
	else
	{

		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer,1);
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJLow(stringOrDoubleList);
	}
	return PDFHummus::eSuccess;	
}